

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O2

int getlx(char **iline,FILE *fp)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  
  pcVar7 = *iline;
  *pcVar7 = '\0';
  sVar3 = 8;
  pcVar5 = pcVar7;
  sVar6 = sVar3;
  do {
    pcVar2 = fgets(pcVar7,(int)sVar6,(FILE *)fp);
    if (pcVar2 == (char *)0x0) {
LAB_00103331:
      piVar4 = __errno_location();
      __stream = _stderr;
      if (*piVar4 == 0) {
        if (*pcVar5 != '\0') {
          pcVar7 = strchr(pcVar7,10);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
          }
          sVar3 = strlen(pcVar5);
          return (int)sVar3;
        }
      }
      else {
        pcVar7 = strerror(*piVar4);
        pcVar5 = "getl - fgets: %s\n";
LAB_00103393:
        fprintf(__stream,pcVar5,pcVar7);
      }
      return -1;
    }
    pcVar2 = strchr(pcVar7,10);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
      goto LAB_00103331;
    }
    sVar3 = sVar3 * 2;
    pcVar2 = (char *)realloc(pcVar5,sVar3);
    __stream = _stderr;
    if (pcVar2 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar7 = strerror(*piVar4);
      pcVar5 = "getl - realloc: %s\n";
      goto LAB_00103393;
    }
    lVar1 = sVar6 - (long)pcVar5;
    sVar6 = sVar3 - (long)(pcVar7 + lVar1);
    pcVar7 = pcVar2 + (long)(pcVar7 + lVar1 + -1);
    pcVar5 = pcVar2;
  } while( true );
}

Assistant:

int getlx(char **iline,FILE *fp)
	{
		char *line = *iline;
		char *newline = NULL;
		char *buf = NULL;
		char *eol = NULL;
		size_t capacity = sizeof(line); /* reasonable starting point for line length */
		size_t remaining = capacity;
		size_t used = 0;

		buf = line; /* point buf -> line */
		line[0] = '\0';

		/* read file  into buf */
		while (fgets(buf, remaining, fp)) {
			eol = strchr(buf, '\n'); /* locate first occurrence of '\n' */
			if (eol) { /* found a newline in the string */
				*eol = '\0'; /* replace the newline with the null character */
				break;
			} else {
				/* buffer was too small - enlarge it */
				used = buf + remaining - line;

				newline = realloc(line, capacity * 2);
				if (!newline) {
					fprintf(stderr, "getl - realloc: %s\n", strerror(errno));
					return -1;
				} else {
					line = newline;
				}

				buf = line + used - 1;
				capacity *= 2;
				remaining = capacity - used;
			}
		}

		if (errno) {
			fprintf(stderr, "getl - fgets: %s\n", strerror(errno));
		} else if (line[0]) {
			char *eol = strchr(buf, '\n');
			if (eol)
				*eol = '\0';
			/*buf = line;*/
			return strlen(line);
		}
		return -1;
	}